

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O2

int8_t __thiscall
I2Cdev::readBits(I2Cdev *this,uint16_t regAddr,uint8_t bitStart,uint8_t length,uint8_t *data,
                uint16_t timeout)

{
  int iVar1;
  byte bVar2;
  undefined6 in_register_00000032;
  undefined2 in_register_0000008a;
  byte local_19;
  
  iVar1 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[0x10])
                    (this,CONCAT62(in_register_00000032,regAddr),&local_19,
                     (ulong)CONCAT22(in_register_0000008a,timeout));
  if ((char)iVar1 != '\0') {
    bVar2 = (bitStart - length) + 1;
    *data = ((byte)(~(-1 << (length & 0x1f)) << (bVar2 & 0x1f)) & local_19) >> (bVar2 & 0x1f);
  }
  return (char)iVar1;
}

Assistant:

int8_t I2Cdev::readBits(uint16_t regAddr, uint8_t bitStart, uint8_t length, uint8_t *data, uint16_t timeout) {
    // 01101001 read byte
    // 76543210 bit numbers
    //    xxx   args: bitStart=4, length=3
    //    010   masked
    //   -> 010 shifted
    uint8_t count, b;
    if ((count = this->readByte(regAddr, &b, timeout)) != 0) {
        uint8_t mask = ((1 << length) - 1) << (bitStart - length + 1);
        b &= mask;
        b >>= (bitStart - length + 1);
        *data = b;
    }
    return count;
}